

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O1

BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
* __thiscall
Js::JavascriptSet::
CreateVarSetFromList<JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
          (JavascriptSet *this,uint initialCapacity)

{
  MapOrSetDataList<void_*> *key;
  Type TVar1;
  bool bVar2;
  Recycler *pRVar3;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_60 [8];
  Iterator iter;
  MapOrSetDataNode<void_*> *local_38;
  
  pRVar3 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  local_60 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  iter.list.ptr = (MapOrSetDataList<void_*> *)0x0;
  iter.current.ptr = (MapOrSetDataNode<void_*> *)&DAT_ffffffffffffffff;
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,(TrackAllocData *)local_60);
  this_00 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar3,0x38bbb2);
  pRVar3 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  JsUtil::
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,pRVar3,initialCapacity);
  Memory::Recycler::WBSetBit((char *)local_60);
  local_60 = (undefined1  [8])&this->list;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((Iterator *)local_60);
  iter.list.ptr = (MapOrSetDataList<void_*> *)0x0;
  bVar2 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_60);
  if (bVar2) {
    do {
      TVar1.ptr = iter.list.ptr;
      key = iter.list.ptr + 1;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38 = (MapOrSetDataNode<void_*> *)TVar1.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,(void **)key,&local_38);
      bVar2 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_60);
    } while (bVar2);
  }
  return this_00;
}

Assistant:

T*
JavascriptSet::CreateVarSetFromList(uint initialCapacity)
{
    T* varSet = RecyclerNew(this->GetRecycler(), T, this->GetRecycler(), initialCapacity);

    JavascriptSet::SetDataList::Iterator iter = this->list.GetIterator();
    // TODO: we can use a more efficient Iterator, since we know there will be no side effects
    while (iter.Next())
    {
        varSet->Add(iter.Current(), iter.CurrentNode());
    }
    return varSet;
}